

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O2

void tcu::separableConvolve<4,4>
               (PixelBufferAccess *dst,ConstPixelBufferAccess *src,int shiftX,int shiftY,
               vector<float,_std::allocator<float>_> *kernelX,
               vector<float,_std::allocator<float>_> *kernelY)

{
  uint uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  deUint32 dVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int i;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  int local_11c;
  Vec4 sum;
  Vector<float,_4> local_e8;
  PixelBufferAccess *local_d8;
  ulong local_d0;
  long local_c8;
  long local_c0;
  vector<float,_std::allocator<float>_> *local_b8;
  PixelBufferAccess tmpAccess;
  tcu local_88 [16];
  TextureLevel tmp;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  
  local_d8 = dst;
  TextureLevel::TextureLevel
            (&tmp,(TextureFormat *)dst,(dst->super_ConstPixelBufferAccess).m_size.m_data[1],
             (dst->super_ConstPixelBufferAccess).m_size.m_data[0],1);
  TextureLevel::getAccess(&tmpAccess,&tmp);
  uVar8 = (ulong)((long)(kernelX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(kernelX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar5 = (ulong)((long)(kernelY->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(kernelY->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  local_d0 = 0;
  if (0 < (int)uVar8) {
    local_d0 = uVar8 & 0xffffffff;
  }
  local_c8 = (uVar8 << 0x20) + -0x100000000;
  local_b8 = kernelY;
  for (lVar9 = 0; uVar8 = (ulong)(src->m_size).m_data[1], lVar9 < (long)uVar8; lVar9 = lVar9 + 1) {
    local_c0 = (long)((int)lVar9 * 4);
    iVar11 = -shiftX;
    for (iVar12 = 0; iVar12 < (src->m_size).m_data[0]; iVar12 = iVar12 + 1) {
      Vector<float,_4>::Vector(&sum,0.0);
      lVar13 = local_c8;
      uVar8 = local_d0;
      iVar10 = iVar11;
      while (bVar14 = uVar8 != 0, uVar8 = uVar8 - 1, bVar14) {
        iVar7 = (src->m_size).m_data[0] + -1;
        if (iVar10 < iVar7) {
          iVar7 = iVar10;
        }
        iVar7 = iVar7 << 2;
        if (iVar10 < 0) {
          iVar7 = 0;
        }
        uVar1 = *(uint *)((long)src->m_data +
                         (long)iVar7 + (long)((src->m_pitch).m_data[1] * (int)lVar9));
        auVar2[0xc] = (char)(uVar1 >> 0x18);
        auVar2._0_12_ = ZEXT712(0);
        local_e8.m_data[0] = (float)(uVar1 & 0xff);
        local_e8.m_data[1] = (float)(uVar1 >> 8 & 0xff);
        local_e8.m_data[2] = (float)(int)CONCAT32(auVar2._10_3_,(ushort)(byte)(uVar1 >> 0x10));
        local_e8.m_data[3] = (float)(uint3)(auVar2._10_3_ >> 0x10);
        operator*(local_88,*(float *)((long)(kernelX->
                                            super__Vector_base<float,_std::allocator<float>_>).
                                            _M_impl.super__Vector_impl_data._M_start +
                                     (lVar13 >> 0x1e)),&local_e8);
        Vector<float,_4>::operator+=(&sum,(Vector<float,_4> *)local_88);
        lVar13 = lVar13 + -0x100000000;
        iVar10 = iVar10 + 1;
      }
      Vector<float,_4>::Vector(&local_40,&sum);
      dVar4 = toColor(&local_40);
      *(deUint32 *)
       ((long)tmpAccess.super_ConstPixelBufferAccess.m_data +
       local_c0 + tmpAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] * iVar12) = dVar4;
      iVar11 = iVar11 + 1;
    }
  }
  uVar6 = 0;
  if (0 < (int)uVar5) {
    uVar6 = uVar5 & 0xffffffff;
  }
  local_11c = -shiftY;
  for (iVar11 = 0; iVar11 < (int)uVar8; iVar11 = iVar11 + 1) {
    for (lVar9 = 0; lVar9 < (src->m_size).m_data[0]; lVar9 = lVar9 + 1) {
      Vector<float,_4>::Vector(&sum,0.0);
      uVar8 = uVar6;
      iVar12 = local_11c;
      lVar13 = uVar5 << 0x20;
      while (lVar13 = lVar13 + -0x100000000, bVar14 = uVar8 != 0, uVar8 = uVar8 - 1, bVar14) {
        iVar10 = tmp.m_size.m_data[0] + -1;
        if (iVar12 < tmp.m_size.m_data[0] + -1) {
          iVar10 = iVar12;
        }
        iVar10 = iVar10 << 2;
        if (iVar12 < 0) {
          iVar10 = 0;
        }
        uVar1 = *(uint *)((long)tmpAccess.super_ConstPixelBufferAccess.m_data +
                         (long)iVar10 +
                         (long)(tmpAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] *
                               (int)lVar9));
        auVar3[0xc] = (char)(uVar1 >> 0x18);
        auVar3._0_12_ = ZEXT712(0);
        local_e8.m_data[0] = (float)(uVar1 & 0xff);
        local_e8.m_data[1] = (float)(uVar1 >> 8 & 0xff);
        local_e8.m_data[2] = (float)(int)CONCAT32(auVar3._10_3_,(ushort)(byte)(uVar1 >> 0x10));
        local_e8.m_data[3] = (float)(uint3)(auVar3._10_3_ >> 0x10);
        operator*(local_88,*(float *)((long)(local_b8->
                                            super__Vector_base<float,_std::allocator<float>_>).
                                            _M_impl.super__Vector_impl_data._M_start +
                                     (lVar13 >> 0x1e)),&local_e8);
        Vector<float,_4>::operator+=(&sum,(Vector<float,_4> *)local_88);
        iVar12 = iVar12 + 1;
      }
      Vector<float,_4>::Vector(&local_50,&sum);
      dVar4 = toColor(&local_50);
      *(deUint32 *)
       ((long)(local_d8->super_ConstPixelBufferAccess).m_data +
       (long)((int)lVar9 * 4) +
       (long)((local_d8->super_ConstPixelBufferAccess).m_pitch.m_data[1] * iVar11)) = dVar4;
    }
    uVar8 = (ulong)(uint)(src->m_size).m_data[1];
    local_11c = local_11c + 1;
  }
  TextureLevel::~TextureLevel(&tmp);
  return;
}

Assistant:

static void separableConvolve (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src, int shiftX, int shiftY, const std::vector<float>& kernelX, const std::vector<float>& kernelY)
{
	DE_ASSERT(dst.getWidth() == src.getWidth() && dst.getHeight() == src.getHeight());

	TextureLevel		tmp			(dst.getFormat(), dst.getHeight(), dst.getWidth());
	PixelBufferAccess	tmpAccess	= tmp.getAccess();

	int kw = (int)kernelX.size();
	int kh = (int)kernelY.size();

	// Horizontal pass
	// \note Temporary surface is written in column-wise order
	for (int j = 0; j < src.getHeight(); j++)
	{
		for (int i = 0; i < src.getWidth(); i++)
		{
			Vec4 sum(0);

			for (int kx = 0; kx < kw; kx++)
			{
				float		f = kernelX[kw-kx-1];
				deUint32	p = readUnorm8<SrcChannels>(src, de::clamp(i+kx-shiftX, 0, src.getWidth()-1), j);

				sum += toFloatVec(p)*f;
			}

			writeUnorm8<DstChannels>(tmpAccess, j, i, toColor(sum));
		}
	}

	// Vertical pass
	for (int j = 0; j < src.getHeight(); j++)
	{
		for (int i = 0; i < src.getWidth(); i++)
		{
			Vec4 sum(0.0f);

			for (int ky = 0; ky < kh; ky++)
			{
				float		f = kernelY[kh-ky-1];
				deUint32	p = readUnorm8<DstChannels>(tmpAccess, de::clamp(j+ky-shiftY, 0, tmp.getWidth()-1), i);

				sum += toFloatVec(p)*f;
			}

			writeUnorm8<DstChannels>(dst, i, j, toColor(sum));
		}
	}
}